

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersectorKHybrid<4,_8,_16781328,_false,_embree::avx::VirtualCurveIntersectorK<8>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray,
              TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  bool bVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  char cVar20;
  AABBNodeMB4D *node1;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong uVar27;
  ulong uVar28;
  float fVar29;
  float fVar35;
  float fVar36;
  vint4 bi_1;
  undefined1 auVar30 [16];
  float fVar37;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 bi_3;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vint4 bi;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar60;
  float fVar61;
  vint4 ai_1;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar62;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vint4 ai;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  vint4 ai_3;
  undefined1 auVar66 [16];
  float fVar67;
  float fVar69;
  float fVar70;
  undefined1 auVar68 [16];
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar81;
  float fVar82;
  undefined1 auVar80 [16];
  float fVar83;
  undefined1 auVar84 [16];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  puVar26 = local_7d0;
  local_7d8 = root.ptr;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4);
  auVar73._4_4_ = fVar3;
  auVar73._0_4_ = fVar3;
  auVar73._8_4_ = fVar3;
  auVar73._12_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar74._4_4_ = fVar4;
  auVar74._0_4_ = fVar4;
  auVar74._8_4_ = fVar4;
  auVar74._12_4_ = fVar4;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar7 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar8 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x40);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar10 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar11 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar12 = (tray->tnear).field_0.i[k];
  auVar80._4_4_ = iVar12;
  auVar80._0_4_ = iVar12;
  auVar80._8_4_ = iVar12;
  auVar80._12_4_ = iVar12;
  iVar12 = (tray->tfar).field_0.i[k];
  auVar84._4_4_ = iVar12;
  auVar84._0_4_ = iVar12;
  auVar84._8_4_ = iVar12;
  auVar84._12_4_ = iVar12;
LAB_003af8c4:
  do {
    bVar13 = puVar26 != &local_7d8;
    if (puVar26 == &local_7d8) {
      return bVar13;
    }
    uVar25 = puVar26[-1];
    puVar26 = puVar26 + -1;
    while ((uVar25 & 8) == 0) {
      fVar67 = *(float *)(ray + k * 4 + 0xe0);
      uVar22 = (uint)uVar25 & 7;
      uVar21 = uVar25 & 0xfffffffffffffff0;
      if (uVar22 == 3) {
        auVar30 = vshufps_avx(ZEXT416((uint)fVar67),ZEXT416((uint)fVar67),0);
        fVar67 = 1.0 - fVar67;
        fVar54 = auVar30._0_4_;
        fVar60 = auVar30._4_4_;
        fVar61 = auVar30._8_4_;
        fVar62 = auVar30._12_4_;
        auVar30 = vshufps_avx(ZEXT416((uint)fVar67),ZEXT416((uint)fVar67),0);
        auVar33 = vshufps_avx(ZEXT416((uint)(fVar67 * 0.0)),ZEXT416((uint)(fVar67 * 0.0)),0);
        fVar29 = auVar33._0_4_;
        fVar35 = auVar33._4_4_;
        fVar36 = auVar33._8_4_;
        fVar37 = auVar33._12_4_;
        fVar79 = auVar30._0_4_;
        auVar72._0_4_ = fVar79 + fVar54 * *(float *)(uVar21 + 0x110);
        fVar81 = auVar30._4_4_;
        auVar72._4_4_ = fVar81 + fVar60 * *(float *)(uVar21 + 0x114);
        fVar82 = auVar30._8_4_;
        auVar72._8_4_ = fVar82 + fVar61 * *(float *)(uVar21 + 0x118);
        fVar83 = auVar30._12_4_;
        auVar72._12_4_ = fVar83 + fVar62 * *(float *)(uVar21 + 0x11c);
        auVar31._0_4_ =
             *(float *)(uVar21 + 0x20) * fVar6 +
             *(float *)(uVar21 + 0x50) * fVar7 + *(float *)(uVar21 + 0x80) * fVar8;
        auVar31._4_4_ =
             *(float *)(uVar21 + 0x24) * fVar6 +
             *(float *)(uVar21 + 0x54) * fVar7 + *(float *)(uVar21 + 0x84) * fVar8;
        auVar31._8_4_ =
             *(float *)(uVar21 + 0x28) * fVar6 +
             *(float *)(uVar21 + 0x58) * fVar7 + *(float *)(uVar21 + 0x88) * fVar8;
        auVar31._12_4_ =
             *(float *)(uVar21 + 0x2c) * fVar6 +
             *(float *)(uVar21 + 0x5c) * fVar7 + *(float *)(uVar21 + 0x8c) * fVar8;
        auVar40._0_4_ =
             fVar7 * *(float *)(uVar21 + 0x60) + *(float *)(uVar21 + 0x90) * fVar8 +
             *(float *)(uVar21 + 0x30) * fVar6;
        auVar40._4_4_ =
             fVar7 * *(float *)(uVar21 + 100) + *(float *)(uVar21 + 0x94) * fVar8 +
             *(float *)(uVar21 + 0x34) * fVar6;
        auVar40._8_4_ =
             fVar7 * *(float *)(uVar21 + 0x68) + *(float *)(uVar21 + 0x98) * fVar8 +
             *(float *)(uVar21 + 0x38) * fVar6;
        auVar40._12_4_ =
             fVar7 * *(float *)(uVar21 + 0x6c) + *(float *)(uVar21 + 0x9c) * fVar8 +
             *(float *)(uVar21 + 0x3c) * fVar6;
        auVar30 = *(undefined1 (*) [16])(uVar21 + 0x40);
        auVar57._0_4_ =
             fVar7 * *(float *)(uVar21 + 0x70) + fVar8 * *(float *)(uVar21 + 0xa0) +
             auVar30._0_4_ * fVar6;
        auVar57._4_4_ =
             fVar7 * *(float *)(uVar21 + 0x74) + fVar8 * *(float *)(uVar21 + 0xa4) +
             auVar30._4_4_ * fVar6;
        auVar57._8_4_ =
             fVar7 * *(float *)(uVar21 + 0x78) + fVar8 * *(float *)(uVar21 + 0xa8) +
             auVar30._8_4_ * fVar6;
        auVar57._12_4_ =
             fVar7 * *(float *)(uVar21 + 0x7c) + fVar8 * *(float *)(uVar21 + 0xac) +
             auVar30._12_4_ * fVar6;
        auVar46._8_4_ = 0x7fffffff;
        auVar46._0_8_ = 0x7fffffff7fffffff;
        auVar46._12_4_ = 0x7fffffff;
        auVar33 = vandps_avx(auVar31,auVar46);
        auVar68._8_4_ = 0x219392ef;
        auVar68._0_8_ = 0x219392ef219392ef;
        auVar68._12_4_ = 0x219392ef;
        auVar33 = vcmpps_avx(auVar33,auVar68,1);
        auVar15 = vblendvps_avx(auVar31,auVar68,auVar33);
        auVar33 = vandps_avx(auVar40,auVar46);
        auVar33 = vcmpps_avx(auVar33,auVar68,1);
        auVar17 = vblendvps_avx(auVar40,auVar68,auVar33);
        auVar33 = vandps_avx(auVar57,auVar46);
        auVar33 = vcmpps_avx(auVar33,auVar68,1);
        auVar33 = vblendvps_avx(auVar57,auVar68,auVar33);
        auVar16 = vrcpps_avx(auVar15);
        fVar85 = auVar16._0_4_;
        auVar32._0_4_ = fVar85 * auVar15._0_4_;
        fVar86 = auVar16._4_4_;
        auVar32._4_4_ = fVar86 * auVar15._4_4_;
        fVar87 = auVar16._8_4_;
        auVar32._8_4_ = fVar87 * auVar15._8_4_;
        fVar88 = auVar16._12_4_;
        auVar32._12_4_ = fVar88 * auVar15._12_4_;
        auVar47._8_4_ = 0x3f800000;
        auVar47._0_8_ = 0x3f8000003f800000;
        auVar47._12_4_ = 0x3f800000;
        auVar15 = vsubps_avx(auVar47,auVar32);
        fVar85 = fVar85 + fVar85 * auVar15._0_4_;
        fVar86 = fVar86 + fVar86 * auVar15._4_4_;
        fVar87 = fVar87 + fVar87 * auVar15._8_4_;
        fVar88 = fVar88 + fVar88 * auVar15._12_4_;
        auVar15 = vrcpps_avx(auVar17);
        fVar67 = auVar15._0_4_;
        auVar41._0_4_ = auVar17._0_4_ * fVar67;
        fVar69 = auVar15._4_4_;
        auVar41._4_4_ = auVar17._4_4_ * fVar69;
        fVar70 = auVar15._8_4_;
        auVar41._8_4_ = auVar17._8_4_ * fVar70;
        fVar71 = auVar15._12_4_;
        auVar41._12_4_ = auVar17._12_4_ * fVar71;
        auVar15 = vsubps_avx(auVar47,auVar41);
        fVar67 = fVar67 + fVar67 * auVar15._0_4_;
        fVar69 = fVar69 + fVar69 * auVar15._4_4_;
        fVar70 = fVar70 + fVar70 * auVar15._8_4_;
        fVar71 = fVar71 + fVar71 * auVar15._12_4_;
        auVar15 = vrcpps_avx(auVar33);
        fVar75 = auVar15._0_4_;
        auVar58._0_4_ = auVar33._0_4_ * fVar75;
        fVar76 = auVar15._4_4_;
        auVar58._4_4_ = auVar33._4_4_ * fVar76;
        fVar77 = auVar15._8_4_;
        auVar58._8_4_ = auVar33._8_4_ * fVar77;
        fVar78 = auVar15._12_4_;
        auVar58._12_4_ = auVar33._12_4_ * fVar78;
        auVar33 = vsubps_avx(auVar47,auVar58);
        fVar75 = fVar75 + fVar75 * auVar33._0_4_;
        fVar76 = fVar76 + fVar76 * auVar33._4_4_;
        fVar77 = fVar77 + fVar77 * auVar33._8_4_;
        fVar78 = fVar78 + fVar78 * auVar33._12_4_;
        auVar33._0_4_ =
             fVar3 * *(float *)(uVar21 + 0x20) +
             *(float *)(uVar21 + 0x50) * fVar4 +
             *(float *)(uVar21 + 0x80) * fVar5 + *(float *)(uVar21 + 0xb0);
        auVar33._4_4_ =
             fVar3 * *(float *)(uVar21 + 0x24) +
             *(float *)(uVar21 + 0x54) * fVar4 +
             *(float *)(uVar21 + 0x84) * fVar5 + *(float *)(uVar21 + 0xb4);
        auVar33._8_4_ =
             fVar3 * *(float *)(uVar21 + 0x28) +
             *(float *)(uVar21 + 0x58) * fVar4 +
             *(float *)(uVar21 + 0x88) * fVar5 + *(float *)(uVar21 + 0xb8);
        auVar33._12_4_ =
             fVar3 * *(float *)(uVar21 + 0x2c) +
             *(float *)(uVar21 + 0x5c) * fVar4 +
             *(float *)(uVar21 + 0x8c) * fVar5 + *(float *)(uVar21 + 0xbc);
        auVar42._0_4_ =
             fVar3 * *(float *)(uVar21 + 0x30) +
             fVar4 * *(float *)(uVar21 + 0x60) +
             *(float *)(uVar21 + 0x90) * fVar5 + *(float *)(uVar21 + 0xc0);
        auVar42._4_4_ =
             fVar3 * *(float *)(uVar21 + 0x34) +
             fVar4 * *(float *)(uVar21 + 100) +
             *(float *)(uVar21 + 0x94) * fVar5 + *(float *)(uVar21 + 0xc4);
        auVar42._8_4_ =
             fVar3 * *(float *)(uVar21 + 0x38) +
             fVar4 * *(float *)(uVar21 + 0x68) +
             *(float *)(uVar21 + 0x98) * fVar5 + *(float *)(uVar21 + 200);
        auVar42._12_4_ =
             fVar3 * *(float *)(uVar21 + 0x3c) +
             fVar4 * *(float *)(uVar21 + 0x6c) +
             *(float *)(uVar21 + 0x9c) * fVar5 + *(float *)(uVar21 + 0xcc);
        auVar53._0_4_ =
             fVar3 * auVar30._0_4_ +
             fVar4 * *(float *)(uVar21 + 0x70) +
             fVar5 * *(float *)(uVar21 + 0xa0) + *(float *)(uVar21 + 0xd0);
        auVar53._4_4_ =
             fVar3 * auVar30._4_4_ +
             fVar4 * *(float *)(uVar21 + 0x74) +
             fVar5 * *(float *)(uVar21 + 0xa4) + *(float *)(uVar21 + 0xd4);
        auVar53._8_4_ =
             fVar3 * auVar30._8_4_ +
             fVar4 * *(float *)(uVar21 + 0x78) +
             fVar5 * *(float *)(uVar21 + 0xa8) + *(float *)(uVar21 + 0xd8);
        auVar53._12_4_ =
             fVar3 * auVar30._12_4_ +
             fVar4 * *(float *)(uVar21 + 0x7c) +
             fVar5 * *(float *)(uVar21 + 0xac) + *(float *)(uVar21 + 0xdc);
        auVar30._4_4_ = fVar35 + fVar60 * *(float *)(uVar21 + 0xe4);
        auVar30._0_4_ = fVar29 + fVar54 * *(float *)(uVar21 + 0xe0);
        auVar30._8_4_ = fVar36 + fVar61 * *(float *)(uVar21 + 0xe8);
        auVar30._12_4_ = fVar37 + fVar62 * *(float *)(uVar21 + 0xec);
        auVar30 = vsubps_avx(auVar30,auVar33);
        auVar33 = vsubps_avx(auVar72,auVar33);
        auVar15._4_4_ = fVar35 + fVar60 * *(float *)(uVar21 + 0xf4);
        auVar15._0_4_ = fVar29 + fVar54 * *(float *)(uVar21 + 0xf0);
        auVar15._8_4_ = fVar36 + fVar61 * *(float *)(uVar21 + 0xf8);
        auVar15._12_4_ = fVar37 + fVar62 * *(float *)(uVar21 + 0xfc);
        auVar15 = vsubps_avx(auVar15,auVar42);
        auVar17._4_4_ = fVar81 + fVar60 * *(float *)(uVar21 + 0x124);
        auVar17._0_4_ = fVar79 + fVar54 * *(float *)(uVar21 + 0x120);
        auVar17._8_4_ = fVar82 + fVar61 * *(float *)(uVar21 + 0x128);
        auVar17._12_4_ = fVar83 + fVar62 * *(float *)(uVar21 + 300);
        auVar17 = vsubps_avx(auVar17,auVar42);
        auVar16._4_4_ = fVar60 * *(float *)(uVar21 + 0x104) + fVar35;
        auVar16._0_4_ = fVar54 * *(float *)(uVar21 + 0x100) + fVar29;
        auVar16._8_4_ = fVar61 * *(float *)(uVar21 + 0x108) + fVar36;
        auVar16._12_4_ = fVar62 * *(float *)(uVar21 + 0x10c) + fVar37;
        auVar16 = vsubps_avx(auVar16,auVar53);
        auVar18._4_4_ = fVar81 + fVar60 * *(float *)(uVar21 + 0x134);
        auVar18._0_4_ = fVar79 + fVar54 * *(float *)(uVar21 + 0x130);
        auVar18._8_4_ = fVar82 + fVar61 * *(float *)(uVar21 + 0x138);
        auVar18._12_4_ = fVar83 + fVar62 * *(float *)(uVar21 + 0x13c);
        auVar18 = vsubps_avx(auVar18,auVar53);
        auVar59._0_4_ = fVar85 * auVar30._0_4_;
        auVar59._4_4_ = fVar86 * auVar30._4_4_;
        auVar59._8_4_ = fVar87 * auVar30._8_4_;
        auVar59._12_4_ = fVar88 * auVar30._12_4_;
        auVar34._0_4_ = fVar85 * auVar33._0_4_;
        auVar34._4_4_ = fVar86 * auVar33._4_4_;
        auVar34._8_4_ = fVar87 * auVar33._8_4_;
        auVar34._12_4_ = fVar88 * auVar33._12_4_;
        auVar66._0_4_ = auVar15._0_4_ * fVar67;
        auVar66._4_4_ = auVar15._4_4_ * fVar69;
        auVar66._8_4_ = auVar15._8_4_ * fVar70;
        auVar66._12_4_ = auVar15._12_4_ * fVar71;
        auVar65._0_4_ = fVar75 * auVar16._0_4_;
        auVar65._4_4_ = fVar76 * auVar16._4_4_;
        auVar65._8_4_ = fVar77 * auVar16._8_4_;
        auVar65._12_4_ = fVar78 * auVar16._12_4_;
        auVar43._0_4_ = auVar17._0_4_ * fVar67;
        auVar43._4_4_ = auVar17._4_4_ * fVar69;
        auVar43._8_4_ = auVar17._8_4_ * fVar70;
        auVar43._12_4_ = auVar17._12_4_ * fVar71;
        auVar48._0_4_ = fVar75 * auVar18._0_4_;
        auVar48._4_4_ = fVar76 * auVar18._4_4_;
        auVar48._8_4_ = fVar77 * auVar18._8_4_;
        auVar48._12_4_ = fVar78 * auVar18._12_4_;
        auVar30 = vpminsd_avx(auVar66,auVar43);
        auVar33 = vpminsd_avx(auVar65,auVar48);
        auVar30 = vmaxps_avx(auVar30,auVar33);
        auVar16 = vpminsd_avx(auVar59,auVar34);
        auVar17 = vpmaxsd_avx(auVar59,auVar34);
        auVar33 = vpmaxsd_avx(auVar66,auVar43);
        auVar15 = vpmaxsd_avx(auVar65,auVar48);
        auVar15 = vminps_avx(auVar33,auVar15);
        auVar33 = vmaxps_avx(auVar80,auVar16);
        auVar30 = vmaxps_avx(auVar33,auVar30);
        auVar33 = vminps_avx(auVar84,auVar17);
        auVar33 = vminps_avx(auVar33,auVar15);
        auVar30 = vcmpps_avx(auVar30,auVar33,2);
      }
      else {
        auVar17 = vshufps_avx(ZEXT416((uint)fVar67),ZEXT416((uint)fVar67),0);
        pfVar2 = (float *)(uVar21 + 0x80 + uVar27);
        fVar67 = auVar17._0_4_;
        fVar75 = auVar17._4_4_;
        fVar69 = auVar17._8_4_;
        fVar76 = auVar17._12_4_;
        pfVar1 = (float *)(uVar21 + 0x20 + uVar27);
        auVar38._0_4_ = fVar67 * *pfVar2 + *pfVar1;
        auVar38._4_4_ = fVar75 * pfVar2[1] + pfVar1[1];
        auVar38._8_4_ = fVar69 * pfVar2[2] + pfVar1[2];
        auVar38._12_4_ = fVar76 * pfVar2[3] + pfVar1[3];
        auVar30 = vsubps_avx(auVar38,auVar73);
        pfVar2 = (float *)(uVar21 + 0x80 + uVar24);
        auVar39._0_4_ = fVar9 * auVar30._0_4_;
        auVar39._4_4_ = fVar9 * auVar30._4_4_;
        auVar39._8_4_ = fVar9 * auVar30._8_4_;
        auVar39._12_4_ = fVar9 * auVar30._12_4_;
        pfVar1 = (float *)(uVar21 + 0x20 + uVar24);
        auVar44._0_4_ = fVar67 * *pfVar2 + *pfVar1;
        auVar44._4_4_ = fVar75 * pfVar2[1] + pfVar1[1];
        auVar44._8_4_ = fVar69 * pfVar2[2] + pfVar1[2];
        auVar44._12_4_ = fVar76 * pfVar2[3] + pfVar1[3];
        auVar30 = vsubps_avx(auVar44,auVar74);
        pfVar2 = (float *)(uVar21 + 0x80 + uVar28);
        pfVar1 = (float *)(uVar21 + 0x20 + uVar28);
        auVar49._0_4_ = fVar67 * *pfVar2 + *pfVar1;
        auVar49._4_4_ = fVar75 * pfVar2[1] + pfVar1[1];
        auVar49._8_4_ = fVar69 * pfVar2[2] + pfVar1[2];
        auVar49._12_4_ = fVar76 * pfVar2[3] + pfVar1[3];
        auVar45._0_4_ = fVar10 * auVar30._0_4_;
        auVar45._4_4_ = fVar10 * auVar30._4_4_;
        auVar45._8_4_ = fVar10 * auVar30._8_4_;
        auVar45._12_4_ = fVar10 * auVar30._12_4_;
        auVar19._4_4_ = fVar5;
        auVar19._0_4_ = fVar5;
        auVar19._8_4_ = fVar5;
        auVar19._12_4_ = fVar5;
        auVar30 = vsubps_avx(auVar49,auVar19);
        auVar50._0_4_ = fVar11 * auVar30._0_4_;
        auVar50._4_4_ = fVar11 * auVar30._4_4_;
        auVar50._8_4_ = fVar11 * auVar30._8_4_;
        auVar50._12_4_ = fVar11 * auVar30._12_4_;
        auVar30 = vmaxps_avx(auVar45,auVar50);
        pfVar2 = (float *)(uVar21 + 0x80 + (uVar27 ^ 0x10));
        pfVar1 = (float *)(uVar21 + 0x20 + (uVar27 ^ 0x10));
        auVar51._0_4_ = fVar67 * *pfVar2 + *pfVar1;
        auVar51._4_4_ = fVar75 * pfVar2[1] + pfVar1[1];
        auVar51._8_4_ = fVar69 * pfVar2[2] + pfVar1[2];
        auVar51._12_4_ = fVar76 * pfVar2[3] + pfVar1[3];
        auVar33 = vsubps_avx(auVar51,auVar73);
        auVar52._0_4_ = fVar9 * auVar33._0_4_;
        auVar52._4_4_ = fVar9 * auVar33._4_4_;
        auVar52._8_4_ = fVar9 * auVar33._8_4_;
        auVar52._12_4_ = fVar9 * auVar33._12_4_;
        pfVar2 = (float *)(uVar21 + 0x80 + (uVar24 ^ 0x10));
        pfVar1 = (float *)(uVar21 + 0x20 + (uVar24 ^ 0x10));
        auVar55._0_4_ = fVar67 * *pfVar2 + *pfVar1;
        auVar55._4_4_ = fVar75 * pfVar2[1] + pfVar1[1];
        auVar55._8_4_ = fVar69 * pfVar2[2] + pfVar1[2];
        auVar55._12_4_ = fVar76 * pfVar2[3] + pfVar1[3];
        auVar33 = vsubps_avx(auVar55,auVar74);
        auVar56._0_4_ = fVar10 * auVar33._0_4_;
        auVar56._4_4_ = fVar10 * auVar33._4_4_;
        auVar56._8_4_ = fVar10 * auVar33._8_4_;
        auVar56._12_4_ = fVar10 * auVar33._12_4_;
        pfVar2 = (float *)(uVar21 + 0x80 + (uVar28 ^ 0x10));
        pfVar1 = (float *)(uVar21 + 0x20 + (uVar28 ^ 0x10));
        auVar63._0_4_ = fVar67 * *pfVar2 + *pfVar1;
        auVar63._4_4_ = fVar75 * pfVar2[1] + pfVar1[1];
        auVar63._8_4_ = fVar69 * pfVar2[2] + pfVar1[2];
        auVar63._12_4_ = fVar76 * pfVar2[3] + pfVar1[3];
        auVar33 = vsubps_avx(auVar63,auVar19);
        auVar64._0_4_ = fVar11 * auVar33._0_4_;
        auVar64._4_4_ = fVar11 * auVar33._4_4_;
        auVar64._8_4_ = fVar11 * auVar33._8_4_;
        auVar64._12_4_ = fVar11 * auVar33._12_4_;
        auVar15 = vminps_avx(auVar56,auVar64);
        auVar33 = vmaxps_avx(auVar80,auVar39);
        auVar30 = vmaxps_avx(auVar33,auVar30);
        auVar33 = vminps_avx(auVar84,auVar52);
        auVar33 = vminps_avx(auVar33,auVar15);
        if (uVar22 == 6) {
          auVar33 = vcmpps_avx(auVar30,auVar33,2);
          auVar30 = vcmpps_avx(*(undefined1 (*) [16])(uVar21 + 0xe0),auVar17,2);
          auVar15 = vcmpps_avx(auVar17,*(undefined1 (*) [16])(uVar21 + 0xf0),1);
          auVar30 = vandps_avx(auVar30,auVar15);
          auVar30 = vandps_avx(auVar30,auVar33);
        }
        else {
          auVar30 = vcmpps_avx(auVar30,auVar33,2);
        }
      }
      auVar30 = vpslld_avx(auVar30,0x1f);
      uVar22 = vmovmskps_avx(auVar30);
      if (uVar22 == 0) goto LAB_003af8c4;
      uVar22 = uVar22 & 0xff;
      lVar14 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
        }
      }
      uVar25 = *(ulong *)(uVar21 + lVar14 * 8);
      uVar22 = uVar22 - 1 & uVar22;
      if (uVar22 != 0) {
        *puVar26 = uVar25;
        puVar26 = puVar26 + 1;
        lVar14 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        uVar25 = *(ulong *)(uVar21 + lVar14 * 8);
        uVar22 = uVar22 - 1 & uVar22;
        uVar23 = (ulong)uVar22;
        if (uVar22 != 0) {
          do {
            *puVar26 = uVar25;
            puVar26 = puVar26 + 1;
            lVar14 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
              }
            }
            uVar25 = *(ulong *)(uVar21 + lVar14 * 8);
            uVar23 = uVar23 & uVar23 - 1;
          } while (uVar23 != 0);
        }
      }
    }
    cVar20 = (**(code **)((long)This->leafIntersector +
                         (ulong)*(byte *)(uVar25 & 0xfffffffffffffff0) * 0x40 + 0x28))
                       (pre,ray,k,context);
    if (cVar20 != '\0') {
      *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
      return bVar13;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }